

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

size_t SSL_get0_peer_delegation_algorithms(SSL *ssl,uint16_t **out_sigalgs)

{
  SSL_HANDSHAKE *pSVar1;
  size_t sVar2;
  uint16_t *puVar3;
  
  pSVar1 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
  if (pSVar1 == (SSL_HANDSHAKE *)0x0) {
    sVar2 = 0;
    puVar3 = (uint16_t *)0x0;
  }
  else {
    puVar3 = (pSVar1->peer_delegated_credential_sigalgs).data_;
    sVar2 = (pSVar1->peer_delegated_credential_sigalgs).size_;
  }
  *out_sigalgs = puVar3;
  return sVar2;
}

Assistant:

size_t SSL_get0_peer_delegation_algorithms(const SSL *ssl,
                                           const uint16_t **out_sigalgs) {
  Span<const uint16_t> sigalgs;
  if (ssl->s3->hs != nullptr) {
    sigalgs = ssl->s3->hs->peer_delegated_credential_sigalgs;
  }
  *out_sigalgs = sigalgs.data();
  return sigalgs.size();
}